

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubModel.cpp
# Opt level: O1

bool __thiscall
iDynTree::SubModelDecomposition::splitModelAlongJoints
          (SubModelDecomposition *this,Model *model,Traversal *fullModelTraversal,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *splitJoints)

{
  size_t __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer puVar2;
  unsigned_long uVar3;
  int iVar4;
  uint uVar5;
  JointIndex JVar6;
  ostream *poVar7;
  size_t __new_size;
  Link *this_00;
  LinkIndex LVar8;
  IJoint *pIVar9;
  undefined4 extraout_var;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  Link *this_01;
  LinkIndex LVar11;
  ulong uVar12;
  ulong uVar13;
  pointer pbVar14;
  long lVar15;
  ulong uVar16;
  size_type *psVar17;
  bool bVar18;
  bool bVar19;
  string jointToParentName;
  unsigned_long local_80;
  string local_50;
  
  pbVar14 = (splitJoints->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  bVar18 = (splitJoints->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish == pbVar14;
  if (!bVar18) {
    uVar12 = 0;
    do {
      JVar6 = Model::getJointIndex(model,pbVar14 + uVar12);
      if (JVar6 == JOINT_INVALID_INDEX) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "[ERROR] SubModelDecomposition::splitModelAlongJoints error : ",0x3d);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr," requested to split the model along joint ",0x2a);
        pbVar14 = (splitJoints->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,pbVar14[uVar12]._M_dataplus._M_p,
                            pbVar14[uVar12]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," but no joint with that is in the model. ",0x29);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
LAB_00164823:
        if (!bVar18) {
          return bVar18;
        }
        break;
      }
      pbVar14 = (splitJoints->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar15 = (long)(splitJoints->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14;
      bVar19 = lVar15 != 0;
      if (bVar19) {
        uVar16 = lVar15 >> 5;
        psVar17 = &pbVar14->_M_string_length;
        uVar13 = 0;
        do {
          if (((uVar12 != uVar13) && (__n = pbVar14[uVar12]._M_string_length, __n == *psVar17)) &&
             ((__n == 0 ||
              (iVar4 = bcmp(pbVar14[uVar12]._M_dataplus._M_p,
                            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (psVar17 + -1))->_M_dataplus)._M_p,__n), iVar4 == 0)))) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "[ERROR] SubModelDecomposition::splitModelAlongJoints error : ",0x3d);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr," the joint ",0xb);
            pbVar14 = (splitJoints->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,pbVar14[uVar12]._M_dataplus._M_p,
                                pbVar14[uVar12]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," is both the element ",0x15);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," and ",5);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7," of the splitJoints list,",0x19);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7," please check the list of joints.",0x21);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            if (bVar19) goto LAB_00164823;
            break;
          }
          uVar13 = uVar13 + 1;
          bVar19 = uVar13 < uVar16;
          psVar17 = psVar17 + 4;
        } while (uVar16 + (uVar16 == 0) != uVar13);
      }
      uVar12 = uVar12 + 1;
      pbVar14 = (splitJoints->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      bVar19 = uVar12 < (ulong)((long)(splitJoints->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14 >>
                               5);
      bVar18 = !bVar19;
    } while (bVar19);
  }
  __new_size = Model::getNrOfLinks(model);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->link2subModelIndex,__new_size);
  setNrOfSubModels(this,((long)(splitJoints->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(splitJoints->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
  uVar5 = Traversal::getNrOfVisitedLinks(fullModelTraversal);
  if (uVar5 != 0) {
    local_80 = 0;
    uVar12 = 0;
    do {
      this_00 = Traversal::getLink(fullModelTraversal,uVar12);
      LVar8 = Link::getIndex(this_00);
      if (uVar12 == 0) {
LAB_0016491e:
        (this->link2subModelIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_start[LVar8] = local_80;
        Traversal::reset((this->subModelTraversals).
                         super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_80],model);
        Traversal::addTraversalBase
                  ((this->subModelTraversals).
                   super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_80],this_00);
        local_80 = local_80 + 1;
      }
      else {
        pIVar9 = Traversal::getParentJoint(fullModelTraversal,uVar12);
        iVar4 = (*pIVar9->_vptr_IJoint[0x14])(pIVar9);
        Model::getJointName_abi_cxx11_(&local_50,model,CONCAT44(extraout_var,iVar4));
        _Var10 = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                           ((splitJoints->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start,
                            (splitJoints->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish,&local_50);
        pbVar1 = (splitJoints->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (_Var10._M_current != pbVar1) goto LAB_0016491e;
        this_01 = Traversal::getParentLink(fullModelTraversal,uVar12);
        pIVar9 = Traversal::getParentJoint(fullModelTraversal,uVar12);
        LVar11 = Link::getIndex(this_01);
        puVar2 = (this->link2subModelIndex).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar3 = puVar2[LVar11];
        puVar2[LVar8] = uVar3;
        Traversal::addTraversalElement
                  ((this->subModelTraversals).
                   super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar3],this_00,pIVar9,this_01);
      }
      uVar12 = uVar12 + 1;
      uVar5 = Traversal::getNrOfVisitedLinks(fullModelTraversal);
    } while (uVar12 < uVar5);
  }
  return bVar18;
}

Assistant:

bool SubModelDecomposition::splitModelAlongJoints(const Model& model,
                                                  const Traversal& fullModelTraversal,
                                                  const std::vector< std::string >& splitJoints)
{
    // first we check that all the splitJoints are actually
    // joints of the model
    for(size_t jnt=0; jnt < splitJoints.size(); jnt++ )
    {
        if( model.getJointIndex(splitJoints[jnt]) == JOINT_INVALID_INDEX )
        {
            std::cerr << "[ERROR] SubModelDecomposition::splitModelAlongJoints error : "
                      << " requested to split the model along joint " << splitJoints[jnt]
                      << " but no joint with that is in the model. " << std::endl;
            return false;
        }

        // Check for duplicates (while it would be possible to handle duplicates,
        // duplicates are tipically associated with some error in the input parameters)
        // O(n^2) solution for checking the duplicates, it can be improved but this simple solution
        // should work fine for tipical uses cases
        for (size_t duplicateJnt=0; duplicateJnt < splitJoints.size(); duplicateJnt++ )
        {
            if (duplicateJnt != jnt && splitJoints[jnt] == splitJoints[duplicateJnt])
            {
                std::cerr << "[ERROR] SubModelDecomposition::splitModelAlongJoints error : "
                          << " the joint " << splitJoints[jnt] << " is both the element "
                          << jnt << " and " << duplicateJnt << " of the splitJoints list,"
                          << " please check the list of joints." << std::endl;
                return false;
            }
        }
    }

    // secondly we check for duplicates

    // The number of link in the decomposition is exactly
    // the number of links in the model
    this->link2subModelIndex.resize(model.getNrOfLinks());

    // we first need to resize the decomposition
    // the number of the submodels is exactly the number of the joints
    // aloing we are dividing the model, plus one
    this->setNrOfSubModels(splitJoints.size()+1);

    // we will assign links to the submodel using a
    // simple scheme: the base of the full tree traversal
    // is assinged to submodel 0. Then we visit the links
    // of the traversal, and we assign a link to the submodel
    // of its parent, unless it is connected to its parent
    // with a joint contained in splitJoints : in that case
    // the link is assigned to a new submodel, and it became
    // the base of the traversal of that submodel .
    size_t newSubModelIndexAvailableToUse = 0;

    for(size_t fullModelTraversalEl=0;
        fullModelTraversalEl < fullModelTraversal.getNrOfVisitedLinks();
        fullModelTraversalEl++)
    {
        LinkConstPtr visitedLink = fullModelTraversal.getLink(fullModelTraversalEl);
        LinkIndex    visitedLinkIndex = visitedLink->getIndex();

        // the link is assigned to a new subModel if
        // the visited link is the base or if it is connected
        // to its parent with a split joint
        bool isLinkBaseOfNewSubModel = false;
        bool isLinkBaseOfFullTreeTraversal = (fullModelTraversalEl == 0);

        if( isLinkBaseOfFullTreeTraversal )
        {
            isLinkBaseOfNewSubModel = true;
        }
        else
        {
            IJointConstPtr jointToParent = fullModelTraversal.getParentJoint(fullModelTraversalEl);
            std::string jointToParentName = model.getJointName(jointToParent->getIndex());

            bool isJointToParentASplitJoint =
                (std::find(splitJoints.begin(), splitJoints.end(), jointToParentName) != splitJoints.end());

            if( isJointToParentASplitJoint )
            {
                isLinkBaseOfNewSubModel = true;
            }

        }

        if( isLinkBaseOfNewSubModel )
        {
            this->link2subModelIndex[visitedLinkIndex] = newSubModelIndexAvailableToUse;
            this->subModelTraversals[newSubModelIndexAvailableToUse]->reset(model);
            this->subModelTraversals[newSubModelIndexAvailableToUse]->addTraversalBase(visitedLink);

            newSubModelIndexAvailableToUse++;
        }
        else
        {
            // In this case we know that the link has a parent,
            // otherwise it would be a base of the submodel traversal
            LinkConstPtr parentLink = fullModelTraversal.getParentLink(fullModelTraversalEl);
            IJointConstPtr jointToParent = fullModelTraversal.getParentJoint(fullModelTraversalEl);

            size_t subModelIndex = this->link2subModelIndex[visitedLinkIndex]
                                 = this->link2subModelIndex[parentLink->getIndex()];

            this->subModelTraversals[subModelIndex]->addTraversalElement(visitedLink,jointToParent,parentLink);
        }
    }

    return true;
}